

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::NearestNeighborsIndex::MergePartialFromCodedStream
          (NearestNeighborsIndex *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  FloatVector *value;
  SingleKdTreeIndex *value_00;
  LinearIndex *value_01;
  SquaredEuclideanDistance *value_02;
  char cVar7;
  ulong uVar8;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_001a6a76;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_001a6a76:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_001a6994:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar5 == 200) {
        if (cVar7 != 'B') goto LAB_001a6994;
        value_02 = mutable_squaredeuclideandistance(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SquaredEuclideanDistance>
                          (input,value_02);
      }
      else if (uVar5 == 2) {
        if (cVar7 != '\x12') goto LAB_001a6994;
        value = google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::Add
                          (&this->floatsamples_);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::FloatVector>(input,value);
      }
      else if (uVar5 == 100) {
        if (cVar7 != '\"') goto LAB_001a6994;
        value_01 = mutable_linearindex(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::LinearIndex>(input,value_01);
      }
      else if (uVar5 == 0x6e) {
        if (cVar7 != 'r') goto LAB_001a6994;
        value_00 = mutable_singlekdtreeindex(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SingleKdTreeIndex>(input,value_00);
      }
      else {
        if ((uVar5 != 1) || (cVar7 != '\b')) goto LAB_001a6994;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->numberofdimensions_);
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NearestNeighborsIndex::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NearestNeighborsIndex)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 numberOfDimensions = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &numberofdimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.FloatVector floatSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_floatsamples()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinearIndex linearIndex = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_singlekdtreeindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_squaredeuclideandistance()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NearestNeighborsIndex)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NearestNeighborsIndex)
  return false;
#undef DO_
}